

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__COLLADA
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  char *pcVar5;
  undefined4 uVar6;
  xmlChar **ppxVar7;
  pair<unsigned_long,_COLLADASaxFWL15::ENUM__version_enum> *enumPair;
  StringHashPair SVar8;
  bool failed_1;
  ParserChar *attributeValue;
  bool failed;
  bool local_129;
  ParserChar *local_128;
  URI *local_120;
  URI local_118;
  
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0xf0);
  *(undefined8 *)pbVar3 = COLLADA__AttributeData::DEFAULT;
  local_120 = (URI *)(pbVar3 + 8);
  COLLADABU::URI::URI(local_120,(URI *)&DAT_009ea6e8,false);
  *attributeDataPtr = pbVar3;
  ppxVar7 = attributes->attributes;
  if (ppxVar7 != (xmlChar **)0x0) {
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_128 = ppxVar7[1];
        if (SVar4 == 0x7f4353) goto LAB_0072054b;
        if (SVar4 == 0x4008f65) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_128,&local_129);
          COLLADABU::URI::operator=(local_120,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_129 == true) &&
             (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x84105c1,0x4008f65,local_128),
             bVar2)) {
LAB_007204f5:
            bVar2 = false;
            validationDataPtr = (void **)0x1;
          }
          else {
            validationDataPtr = (void **)0x4;
            bVar2 = true;
            if (local_129 == false) {
              *pbVar3 = *pbVar3 | 1;
            }
          }
LAB_00720546:
          if (bVar2) {
LAB_0072054b:
            validationDataPtr = (void **)0x0;
          }
        }
        else {
          if (SVar4 == 0xcc9a02e) {
            pcVar5 = (char *)GeneratedSaxParser::Utils::calculateStringHash
                                       (local_128,(bool *)&local_118);
            bVar2 = true;
            do {
              bVar1 = bVar2;
              uVar6 = SUB84(validationDataPtr,0);
              if (!bVar1) break;
              if (pcVar5 == "t__technique_commonEv") {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                validationDataPtr = (void **)0x0;
              }
              uVar6 = SUB84(validationDataPtr,0);
              bVar2 = false;
            } while (pcVar5 != "t__technique_commonEv");
            if (!bVar1) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
              uVar6 = 1;
            }
            *(undefined4 *)(pbVar3 + 4) = uVar6;
            if (((char)local_118.mUriString._M_dataplus._M_p == '\x01') &&
               (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x84105c1,0xcc9a02e,local_128),
               bVar2)) goto LAB_007204f5;
            validationDataPtr = (void **)0x4;
            bVar2 = true;
            goto LAB_00720546;
          }
          SVar8 = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(text);
          if (SVar8.first == 0x7f4353) goto LAB_0072054b;
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x84105c1,text,local_128);
          validationDataPtr = (void **)0x1;
          if (!bVar2) goto LAB_0072054b;
        }
        ppxVar7 = ppxVar7 + 2;
      }
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*pbVar3 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(local_120,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  if ((*(int *)(pbVar3 + 4) == 2) &&
     (bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x84105c1,0xcc9a02e,(ParserChar *)0x0),
     bVar2)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__COLLADA( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__COLLADA( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

COLLADA__AttributeData* attributeData = newData<COLLADA__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VERSION:
    {
bool failed;
attributeData->version = Utils::toEnum<ENUM__version_enum, StringHash, ENUM__version_enum__COUNT>(attributeValue, failed, ENUM__version_enumMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLLADA,
        HASH_ATTRIBUTE_VERSION,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_BASE:
    {
bool failed;
attributeData->base = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLLADA,
        HASH_ATTRIBUTE_BASE,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= COLLADA__AttributeData::ATTRIBUTE_BASE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_XMLNS:
    {
    // ignore

    break;
    }
    default:
    {
        StringHashPair hashPair = Utils::calculateStringHashWithNamespace( attribute );
        if ( hashPair.first != HASH_ATTRIBUTE_XMLNS )
        {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_COLLADA, attribute, attributeValue))
            {return false;}        }
        else
        {
            // ignore
        }

    }
    }
    }
}
if ((attributeData->present_attributes & COLLADA__AttributeData::ATTRIBUTE_BASE_PRESENT) == 0)
{
    attributeData->base = COLLADABU::URI("");
}
if ( attributeData->version == ENUM__version_enum__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_COLLADA, HASH_ATTRIBUTE_VERSION, 0 ) )
        return false;
}


    return true;
}